

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O2

Var Js::JavascriptObject::DefinePropertiesHelperForGenericObjects
              (RecyclableObject *object,RecyclableObject *props,ScriptContext *scriptContext)

{
  code *pcVar1;
  int iVar2;
  BOOL BVar3;
  Recycler *pRVar4;
  undefined4 *puVar5;
  JavascriptString *propertyString;
  DescriptorMap *pDVar6;
  Var propertySpec;
  PropertyRecord *pPVar7;
  size_t count;
  size_t count_00;
  ulong AllocFunc;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  undefined1 local_f0 [8];
  JavascriptStaticEnumerator enumerator;
  TrackAllocData data;
  PropertyRecord *local_48;
  PropertyRecord *propertyRecord;
  DescriptorMap *descriptors;
  PropertyId propId;
  
  JavascriptStaticEnumerator::JavascriptStaticEnumerator((JavascriptStaticEnumerator *)local_f0);
  iVar2 = (*(props->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x2b])
                    (props,(JavascriptStaticEnumerator *)local_f0,2,scriptContext,0);
  if (iVar2 != 0) {
    EnterPinnedScope(&propertyRecord);
    enumerator.arrayEnumerator.ptr =
         (JavascriptEnumerator *)
         &DefinePropertiesHelperForGenericObjects(Js::RecyclableObject*,Js::RecyclableObject*,Js::ScriptContext*)
          ::DescriptorMap::typeinfo;
    pRVar4 = Memory::Recycler::TrackAllocInfo
                       (scriptContext->recycler,(TrackAllocData *)&enumerator.arrayEnumerator);
    AllocFunc = 0x10;
    propertyRecord =
         (PropertyRecord *)
         Memory::
         AllocateArray<Memory::Recycler,Js::JavascriptObject::DefinePropertiesHelperForGenericObjects(Js::RecyclableObject*,Js::RecyclableObject*,Js::ScriptContext*)::DescriptorMap,false>
                   (pRVar4,0x10,count);
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    uVar10 = 0;
    while (propertyString =
                JavascriptStaticEnumerator::MoveAndGetNext
                          ((JavascriptStaticEnumerator *)local_f0,
                           (PropertyId *)((long)&descriptors + 4),(PropertyAttributes *)0x0),
          propertyString != (JavascriptString *)0x0) {
      if (descriptors._4_4_ == -1) {
        ScriptContext::GetOrAddPropertyRecord(scriptContext,propertyString,&local_48);
        descriptors._4_4_ = local_48->pid;
      }
      else {
        (*(propertyString->super_RecyclableObject).super_FinalizableObject.
          super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x61])
                  (propertyString,&local_48,0);
      }
      pDVar6 = (DescriptorMap *)propertyRecord;
      if (uVar10 == AllocFunc) {
        AllocFunc = uVar10 * 2;
        if ((long)uVar10 < 0) {
          AllocFunc = 0xffffffffffffffff;
        }
        enumerator.arrayEnumerator.ptr =
             (JavascriptEnumerator *)
             &DefinePropertiesHelperForGenericObjects(Js::RecyclableObject*,Js::RecyclableObject*,Js::ScriptContext*)
              ::DescriptorMap::typeinfo;
        pRVar4 = Memory::Recycler::TrackAllocInfo
                           (scriptContext->recycler,(TrackAllocData *)&enumerator.arrayEnumerator);
        pDVar6 = Memory::
                 AllocateArray<Memory::Recycler,Js::JavascriptObject::DefinePropertiesHelperForGenericObjects(Js::RecyclableObject*,Js::RecyclableObject*,Js::ScriptContext*)::DescriptorMap,false>
                           (pRVar4,AllocFunc,count_00);
        lVar8 = 0;
        uVar9 = uVar10;
        while (pPVar7 = propertyRecord, bVar11 = uVar9 != 0, uVar9 = uVar9 - 1, bVar11) {
          Memory::WriteBarrierPtr<const_Js::PropertyRecord>::operator=
                    ((WriteBarrierPtr<const_Js::PropertyRecord> *)
                     ((long)&(pDVar6->propRecord).ptr + lVar8),
                     (WriteBarrierPtr<const_Js::PropertyRecord> *)
                     ((long)&(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                             _vptr_IRecyclerVisitedObject + lVar8));
          PropertyDescriptor::operator=
                    ((PropertyDescriptor *)((long)&(pDVar6->descriptor).Value.ptr + lVar8),
                     (PropertyDescriptor *)((long)&pPVar7->pid + lVar8));
          Memory::WriteBarrierPtr<void>::operator=
                    ((WriteBarrierPtr<void> *)((long)&(pDVar6->originalVar).ptr + lVar8),
                     (WriteBarrierPtr<void> *)((long)&pPVar7[2].pid + lVar8));
          lVar8 = lVar8 + 0x40;
        }
      }
      propertyRecord = (PropertyRecord *)pDVar6;
      propertySpec = JavascriptOperators::GetPropertyNoCache(props,descriptors._4_4_,scriptContext);
      if (AllocFunc <= uVar10) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar5 = 1;
        bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                     ,0x798,"(descCount < descSize)","descCount < descSize");
        if (!bVar11) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
      lVar8 = uVar10 * 0x40;
      BVar3 = JavascriptOperators::ToPropertyDescriptor
                        (propertySpec,(PropertyDescriptor *)((long)propertyRecord + lVar8 + 8),
                         scriptContext);
      if (BVar3 == 0) {
        pPVar7 = ScriptContext::GetPropertyName(scriptContext,descriptors._4_4_);
        JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec2c,(PCWSTR)(pPVar7 + 1));
      }
      Memory::WriteBarrierPtr<void>::WriteBarrierSet
                ((WriteBarrierPtr<void> *)((long)propertyRecord + lVar8 + 0x38),propertySpec);
      if (DAT_0145948b == '\x01') {
        ModifyGetterSetterFuncName
                  (local_48,(PropertyDescriptor *)((long)propertyRecord + lVar8 + 8),scriptContext);
      }
      Memory::WriteBarrierPtr<const_Js::PropertyRecord>::WriteBarrierSet
                ((WriteBarrierPtr<const_Js::PropertyRecord> *)(lVar8 + (long)propertyRecord),
                 local_48);
      uVar10 = uVar10 + 1;
    }
    lVar8 = 8;
    while (bVar11 = uVar10 != 0, uVar10 = uVar10 - 1, bVar11) {
      DefineOwnPropertyHelper
                (object,*(PropertyId *)(*(long *)((long)propertyRecord + lVar8 + -8) + 8),
                 (PropertyDescriptor *)
                 ((long)&(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                         _vptr_IRecyclerVisitedObject + lVar8),scriptContext,true);
      lVar8 = lVar8 + 0x40;
    }
    LeavePinnedScope();
  }
  return object;
}

Assistant:

Var JavascriptObject::DefinePropertiesHelperForGenericObjects(RecyclableObject *object, RecyclableObject* props, ScriptContext *scriptContext)
{
    size_t descSize = 16;
    size_t descCount = 0;
    struct DescriptorMap
    {
        Field(PropertyRecord const *) propRecord;
        Field(PropertyDescriptor) descriptor;
        Field(Var) originalVar;
    };

    JavascriptStaticEnumerator enumerator;
    if (!props->GetEnumerator(&enumerator, EnumeratorFlags::EnumSymbols, scriptContext))
    {
        return object;
    }

    ENTER_PINNED_SCOPE(DescriptorMap, descriptors);
    descriptors = RecyclerNewArray(scriptContext->GetRecycler(), DescriptorMap, descSize);

    PropertyId propId;
    PropertyRecord const * propertyRecord;
    JavascriptString* propertyName = nullptr;

    //enumerate through each property of properties and fetch the property descriptor
    while ((propertyName = enumerator.MoveAndGetNext(propId)) != NULL)
    {
        if (propId == Constants::NoProperty) //try current property id query first
        {
            scriptContext->GetOrAddPropertyRecord(propertyName, &propertyRecord);
            propId = propertyRecord->GetPropertyId();
        }
        else
        {
            propertyName->GetPropertyRecord(&propertyRecord);
        }

        if (descCount == descSize)
        {
            //reallocate - consider linked list of DescriptorMap if the descSize is too high
            descSize = AllocSizeMath::Mul(descCount, 2);
            __analysis_assume(descSize == descCount * 2);
            DescriptorMap *temp = RecyclerNewArray(scriptContext->GetRecycler(), DescriptorMap, descSize);

            for (size_t i = 0; i < descCount; i++)
            {
                temp[i] = descriptors[i];
            }
            descriptors = temp;
        }

        Var tempVar = JavascriptOperators::GetPropertyNoCache(props, propId, scriptContext);

        AnalysisAssert(descCount < descSize);
        if (!JavascriptOperators::ToPropertyDescriptor(tempVar, &descriptors[descCount].descriptor, scriptContext))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_PropertyDescriptor_Invalid, scriptContext->GetPropertyName(propId)->GetBuffer());
        }
        // In proxy, we need to get back the original ToPropertDescriptor var in [[defineProperty]] trap.
        descriptors[descCount].originalVar = tempVar;

        if (CONFIG_FLAG(UseFullName))
        {
            ModifyGetterSetterFuncName(propertyRecord, descriptors[descCount].descriptor, scriptContext);
        }

        descriptors[descCount].propRecord = propertyRecord;

        descCount++;
    }

    //Once all the property descriptors are in place set each property descriptor to the object
    for (size_t i = 0; i < descCount; i++)
    {
        DefineOwnPropertyHelper(object, descriptors[i].propRecord->GetPropertyId(), descriptors[i].descriptor, scriptContext);
    }

    LEAVE_PINNED_SCOPE();

    return object;
}